

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perfetto.cc
# Opt level: O0

void __thiscall perfetto::protos::gen::ConsoleConfig::~ConsoleConfig(ConsoleConfig *this)

{
  ConsoleConfig *this_local;
  
  (this->super_CppMessageObj)._vptr_CppMessageObj = (_func_int **)&PTR__ConsoleConfig_009c1378;
  ::std::__cxx11::string::~string((string *)&this->unknown_fields_);
  protozero::CppMessageObj::~CppMessageObj(&this->super_CppMessageObj);
  return;
}

Assistant:

ConsoleConfig::~ConsoleConfig() = default;